

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O3

ztast_scope_t * ztast_scope(ztast_t *ast,ztast_statement_t *stmt)

{
  ztast_scope_t *pzVar1;
  
  pzVar1 = (ztast_scope_t *)(*ast->mallocfn)(8,ast->opaque);
  if (pzVar1 != (ztast_scope_t *)0x0) {
    pzVar1->statements = stmt;
  }
  return pzVar1;
}

Assistant:

ztast_scope_t *ztast_scope(ztast_t *ast, ztast_statement_t *stmt)
{
  ztast_scope_t *scope;

  assert(ast);
  /* statement may be NULL */

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_scope\n");
#endif

  scope = ZTAST_MALLOC(sizeof(*scope));
  if (scope == NULL)
    return NULL;

  scope->statements = stmt;

  return scope;
}